

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O0

void __thiscall App::setup(App *this)

{
  int iVar1;
  allocator local_31;
  string local_30 [32];
  App *local_10;
  App *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"data/spritesheet.json",&local_31);
  piksel::Spritesheet::load(&this->spritesheet,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Character::setup(&this->character,&this->spritesheet,(this->super_BaseApp).height);
  initBricks(this);
  iVar1 = piksel::BaseApp::millis(&this->super_BaseApp);
  piksel::Timer::reset(&this->enemySpawnTimer,iVar1);
  iVar1 = piksel::BaseApp::millis(&this->super_BaseApp);
  Ball::setup(&this->ball,iVar1);
  return;
}

Assistant:

void App::setup() {
    spritesheet.load("data/spritesheet.json");
    character.setup(spritesheet, height);
    initBricks();
    enemySpawnTimer.reset(millis());
    ball.setup(millis());
}